

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O3

char * test_matrix4_transformation_translatev3(void)

{
  int iVar1;
  char *pcVar2;
  vector3 expectedPosition;
  vector3 translation;
  vector3 startingPosition;
  matrix4 transform;
  anon_union_12_3_07544b15_for_vector3_0 local_88;
  anon_union_12_3_07544b15_for_vector3_0 local_78;
  anon_union_12_3_07544b15_for_vector3_0 local_68;
  matrix4 local_58;
  
  local_68._0_8_ = 0x3f80000000000000;
  local_68.v[2] = 0.0;
  local_78.v[2] = 0.1;
  local_78._0_8_ = 0x3dcccccd3dcccccd;
  local_88.v[2] = 0.1;
  local_88._0_8_ = 0x3f8ccccd3dcccccd;
  matrix4_make_transformation_translationv3(&local_58,(vector3 *)&local_78.field_1);
  vector3_multiplym4((vector3 *)&local_68.field_1,&local_58);
  iVar1 = vector3_equals((vector3 *)&local_68.field_1,(vector3 *)&local_88.field_1);
  pcVar2 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(248) : (assertion failed) ((vector3_equals(&startingPosition, &expectedPosition)))"
    ;
  }
  return pcVar2;
}

Assistant:

static char *test_matrix4_transformation_translatev3(void)
{
	struct matrix4 transform;

	struct vector3 startingPosition = {0.0f, 1.0f, 0.0f};
	struct vector3 translation = {0.1f, 0.1f, 0.1f};
	struct vector3 expectedPosition = {0.1f, 1.1f, 0.1f};

	matrix4_make_transformation_translationv3(&transform, &translation);
	vector3_multiplym4(&startingPosition, &transform);
	test_assert(vector3_equals(&startingPosition, &expectedPosition));

	return NULL;
}